

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O0

void eltcalc::doit(bool skipHeader,bool ordOutput,FILE **fout,
                  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *parquetFileNames)

{
  bool bVar1;
  undefined1 local_38 [4];
  int local_34;
  uint summaryset_id;
  uint samplesize;
  size_t i;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmStack_20;
  uint stream_type;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *parquetFileNames_local;
  FILE **fout_local;
  bool ordOutput_local;
  bool skipHeader_local;
  
  i._4_4_ = 0;
  pmStack_20 = parquetFileNames;
  parquetFileNames_local =
       (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)fout;
  fout_local._6_1_ = ordOutput;
  fout_local._7_1_ = skipHeader;
  _summaryset_id = fread((void *)((long)&i + 4),4,1,_stdin);
  if (((fout_local._6_1_ & 1) != 0) && (*(long *)&(parquetFileNames_local->_M_t)._M_impl != 0)) {
    GetEventRates();
  }
  bVar1 = isSummaryCalcStream(i._4_4_);
  if (bVar1) {
    _summaryset_id = fread(&local_34,4,1,_stdin);
    if (((fout_local._6_1_ & 1) != 0) &&
       (*(long *)&(parquetFileNames_local->_M_t)._M_impl.super__Rb_tree_header._M_header != 0)) {
      GetIntervals(local_34);
    }
    if (_summaryset_id == 1) {
      _summaryset_id = fread(local_38,4,1,_stdin);
    }
    if (_summaryset_id == 1) {
      doeltoutput(local_34,(bool)(fout_local._7_1_ & 1),(bool)(fout_local._6_1_ & 1),
                  (FILE **)parquetFileNames_local,pmStack_20);
    }
    else {
      fprintf(_stderr,"FATAL: Stream read error\n");
    }
    return;
  }
  fprintf(_stderr,"FATAL: %s: Not a gul stream\n","doit");
  fprintf(_stderr,"FATAL: %s: invalid stream type %d\n","doit",(ulong)i._4_4_);
  exit(-1);
}

Assistant:

void doit(bool skipHeader, bool ordOutput, FILE **fout,
		  std::map<int, std::string> &parquetFileNames)
	{
		unsigned int stream_type = 0;
		size_t i = fread(&stream_type, sizeof(stream_type), 1, stdin);

#ifdef HAVE_PARQUET
		if ((ordOutput && fout[MELT] != nullptr) ||
		    parquetFileNames.find(OasisParquet::MELT) != parquetFileNames.end()) {
			GetEventRates();
		}
#else
		if (ordOutput && fout[MELT] != nullptr) GetEventRates();
#endif

		if (isSummaryCalcStream(stream_type) == true) {
			unsigned int samplesize;
			unsigned int summaryset_id;
			i = fread(&samplesize, sizeof(samplesize), 1, stdin);

#ifdef HAVE_PARQUET
			if ((ordOutput && fout[QELT] != nullptr) ||
			    parquetFileNames.find(OasisParquet::QELT) != parquetFileNames.end()) {
				GetIntervals(samplesize);
			}
#else
			if (ordOutput && fout[QELT] != nullptr) GetIntervals(samplesize);
#endif

			if (i == 1) i = fread(&summaryset_id,
					      sizeof(summaryset_id), 1, stdin);
			if (i == 1) {
				doeltoutput(samplesize, skipHeader, ordOutput,
					    fout, parquetFileNames);
			}
			else {
				fprintf(stderr, "FATAL: Stream read error\n");
			}
			return;
		}

		fprintf(stderr, "FATAL: %s: Not a gul stream\n", __func__);
		fprintf(stderr, "FATAL: %s: invalid stream type %d\n", __func__, stream_type);
		exit(-1);
	}